

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_coin.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::api::CoinApi::ConvertToUtxo
          (CoinApi *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  bool bVar1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RDX;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  UtxoData *utxo_data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  Utxo *in_stack_00000180;
  UtxoData *in_stack_00000188;
  CoinApi *in_stack_00000190;
  reference in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffffa8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_48;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_40;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_38 [3];
  undefined1 local_19;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x3ffb84);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size(local_18);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_38[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_ffffffffffffff88
                         );
  local_40 = local_18;
  local_48._M_current =
       (UtxoData *)
       std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                 ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffff88
                 );
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    in_stack_ffffffffffffff88 =
         __gnu_cxx::
         __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
         ::operator*(&local_48);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator*(local_38);
    ConvertToUtxo(in_stack_00000190,in_stack_00000188,in_stack_00000180);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_38);
    __gnu_cxx::
    __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
    ::operator++(&local_48);
  }
  return in_RDI;
}

Assistant:

std::vector<Utxo> CoinApi::ConvertToUtxo(
    const std::vector<UtxoData>& utxos) const {
  std::vector<Utxo> result;
  result.resize(utxos.size());
  std::vector<Utxo>::iterator ite = result.begin();
  for (const auto& utxo_data : utxos) {
    ConvertToUtxo(utxo_data, &(*ite));
    ++ite;
  }
  return result;
}